

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O3

AutorunType __thiscall DiskGen::GetAutorun(DiskGen *this,char *buffer,uint size_of_buffer)

{
  char *search_ext;
  char **__s1;
  AutorunType AVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  pointer pRVar5;
  char *pcVar6;
  uint uVar7;
  pointer pbVar8;
  pointer pbVar9;
  int iVar10;
  vector<Rule,_std::allocator<Rule>_> rule_list;
  AutorunType ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filename_vector;
  string disk_filename;
  value_type local_c8;
  vector<Rule,_std::allocator<Rule>_> local_a8;
  uint local_8c;
  pointer local_88;
  pointer local_80;
  AutorunType local_74;
  pointer local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50;
  int local_48;
  long local_40 [2];
  
  IDisk::GetCAT_abi_cxx11_(&local_68,this->disk_,&local_74,0);
  if (this->disk_ == (IDisk *)0x0) {
    pcVar6 = "";
  }
  else {
    pcVar6 = (this->disk_->current_disk_path_)._M_dataplus._M_p;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,pcVar6,(allocator<char> *)&local_a8);
  local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.name_._0_5_ = 0x16a9d4;
  local_c8._5_4_ = 0x94000000;
  local_c8.ext_._1_4_ = 0x16c1;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "DISC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16a9de;
  local_c8._5_4_ = 0x94000000;
  local_c8.ext_._1_4_ = 0x16c1;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "DISK";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16a9d4;
  local_c8._5_4_ = 0xe8000000;
  local_c8.ext_._1_4_ = 0x16a9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "DISC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16a9de;
  local_c8._5_4_ = 0xe8000000;
  local_c8.ext_._1_4_ = 0x16a9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "DISK";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16a9ec;
  local_c8._5_4_ = 0x94000000;
  local_c8.ext_._1_4_ = 0x16c1;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "ELITE";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16a9ec;
  local_c8._5_4_ = 0xe8000000;
  local_c8.ext_._1_4_ = 0x16a9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "ELITE";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16a9f8;
  local_c8._5_4_ = 0x94000000;
  local_c8.ext_._1_4_ = 0x16c1;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16a9f8;
  local_c8._5_4_ = 0xe8000000;
  local_c8.ext_._1_4_ = 0x16a9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16a9f8;
  local_c8._5_4_ = 0xbb000000;
  local_c8.ext_._1_4_ = 0x16b9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "UBI";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa00;
  local_c8._5_4_ = 0x94000000;
  local_c8.ext_._1_4_ = 0x16c1;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "ERE.BAS";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa00;
  local_c8._5_4_ = 0xe8000000;
  local_c8.ext_._1_4_ = 0x16a9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "ERE.BAS";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa0c;
  local_c8._5_4_ = 0x94000000;
  local_c8.ext_._1_4_ = 0x16c1;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "MBC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa0c;
  local_c8._5_4_ = 0xe8000000;
  local_c8.ext_._1_4_ = 0x16a9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "MBC";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa14;
  local_c8._5_4_ = 0xe8000000;
  local_c8.ext_._1_4_ = 0x16a9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa14;
  local_c8._5_4_ = 0x94000000;
  local_c8.ext_._1_4_ = 0x16c1;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa14;
  local_c8._5_4_ = 0xbb000000;
  local_c8.ext_._1_4_ = 0x16b9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "ESAT";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa1e;
  local_c8._5_4_ = 0x94000000;
  local_c8.ext_._1_4_ = 0x16c1;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "JEU";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  local_c8.name_._0_5_ = 0x16aa1e;
  local_c8._5_4_ = 0xe8000000;
  local_c8.ext_._1_4_ = 0x16a9;
  local_c8.ext_._5_2_ = 0;
  local_c8.ext_._7_1_ = 0;
  local_c8.autofile_ = "JEU";
  std::vector<Rule,_std::allocator<Rule>_>::push_back(&local_a8,&local_c8);
  pbVar9 = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_70 = local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_88 = local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_80 = local_68.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pRVar5 = local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (local_80 != pbVar9) {
        pcVar6 = pRVar5->name_;
        search_ext = pRVar5->ext_;
        pbVar8 = local_80;
        do {
          bVar2 = CompareStringFromCat((pbVar8->_M_dataplus)._M_p,pcVar6,search_ext);
          if (bVar2) {
            strcpy(buffer,pRVar5->autofile_);
            goto LAB_00133d87;
          }
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar9);
      }
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != local_88);
  }
  local_80 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_88 = (pointer)CONCAT71(local_88._1_7_,1);
    local_8c = 0;
    iVar10 = 0;
    pbVar9 = local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      __s1 = &local_c8.ext_;
      pcVar6 = (pbVar9->_M_dataplus)._M_p;
      local_c8.ext_._7_1_ = 0;
      local_c8.ext_._5_2_ = 0;
      local_c8.name_._0_5_ = (undefined5)*(undefined8 *)pcVar6;
      local_c8.ext_._0_1_ = (undefined1)((ulong)*(undefined8 *)(pcVar6 + 5) >> 0x18);
      local_c8.name_._5_3_ = (undefined3)((ulong)*(undefined8 *)pcVar6 >> 0x28);
      local_c8.ext_._1_4_ = (uint)((ulong)*(undefined8 *)(pcVar6 + 5) >> 0x20) & 0xffffff7f;
      local_c8._5_4_ = CONCAT13(local_c8.ext_._0_1_,local_c8.name_._5_3_) & 0x7fffffff;
      iVar3 = strncasecmp((char *)__s1,"bin",3);
      if (((iVar3 == 0) || (iVar3 = strncasecmp((char *)__s1,"bas",3), iVar3 == 0)) ||
         (iVar3 = strncasecmp((char *)__s1,"   ",3), iVar3 == 0)) {
        iVar3 = NbIdenticalCar(pcVar6,(char *)local_50,local_48);
        if ((pcVar6[8] == 'B') &&
           (((pcVar6[9] == 'I' && (pcVar6[10] == 'N')) ||
            ((pcVar6[9] == 'A' && (pcVar6[10] == 'S')))))) {
          uVar7 = (uint)CONCAT71((int7)((ulong)__s1 >> 8),1);
        }
        else {
          uVar7 = 0;
        }
        if (((((iVar10 == 0 || iVar10 < iVar3) || ((((ulong)local_88 & 1) != 0 && (-1 < pcVar6[9])))
              ) || (((local_8c & 1) == 0 & (byte)uVar7) == 1)) &&
            ((((ulong)local_88 & 1) != 0 || (-1 < pcVar6[9])))) &&
           (((byte)uVar7 != 0 || ((local_8c & 1) == 0)))) {
          local_88 = (pointer)CONCAT71(local_88._1_7_,(byte)pcVar6[9] >> 7);
          sprintf(buffer,"%8.8s",pcVar6);
          uVar4 = 7;
          do {
            if (buffer[uVar4] != ' ') break;
            buffer[uVar4] = '\0';
            bVar2 = uVar4 != 0;
            uVar4 = uVar4 - 1;
          } while (bVar2);
          local_80 = local_68.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          iVar10 = iVar3;
          local_8c = uVar7;
        }
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != local_80);
  }
  if (*buffer != '\0') {
LAB_00133d87:
    local_74 = AUTO_FILE;
  }
  AVar1 = local_74;
  if (local_70 != (pointer)0x0) {
    operator_delete(local_70,(long)local_a8.super__Vector_base<Rule,_std::allocator<Rule>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return AVar1;
}

Assistant:

IDisk::AutorunType DiskGen::GetAutorun(char* buffer, unsigned int size_of_buffer)
{
   IDisk::AutorunType ret;
   bool end = false;
   int nb_correct_char = 0;
   bool correct_hidden = 1;

   std::vector<std::string> filename_vector = disk_->GetCAT(ret);

   // Get disk name
   std::string disk_filename = GetCurrentLoadedDisk();

   // Specific rules : for specific disks !
   //todo

   // Generic Rules
   class Rule
   {
   public:
      Rule(const char* name, const char* ext, const char* autofile) : name_(name), ext_(ext), autofile_(autofile)
      {
      }

      const char* name_;
      const char* ext_;
      const char* autofile_;
   };

   std::vector<Rule> rule_list;
   rule_list.push_back(Rule("disc", "bin", "DISC"));
   rule_list.push_back(Rule("disk", "bin", "DISK"));
   rule_list.push_back(Rule("disc", "bas", "DISC"));
   rule_list.push_back(Rule("disk", "bas", "DISK"));
   rule_list.push_back(Rule("elite", "bin", "ELITE"));
   rule_list.push_back(Rule("elite", "bas", "ELITE"));
   rule_list.push_back(Rule("ubi", "bin", "UBI"));
   rule_list.push_back(Rule("ubi", "bas", "UBI"));
   rule_list.push_back(Rule("ubi", "", "UBI"));
   rule_list.push_back(Rule("ere", "bin", "ERE.BAS"));
   rule_list.push_back(Rule("ere", "bas", "ERE.BAS"));
   rule_list.push_back(Rule("mbc", "bin", "MBC"));
   rule_list.push_back(Rule("mbc", "bas", "MBC"));
   rule_list.push_back(Rule("esat", "bas", "ESAT"));
   rule_list.push_back(Rule("esat", "bin", "ESAT"));
   rule_list.push_back(Rule("esat", "", "ESAT"));
   rule_list.push_back(Rule("jeu", "bin", "JEU"));
   rule_list.push_back(Rule("jeu", "bas", "JEU"));

   for (auto it = rule_list.begin(); it != rule_list.end() && (end == false); it++)
   {
      if (FindName(filename_vector, it->name_, it->ext_))
      {
         strcpy(buffer, it->autofile_);
         end = true;
      }
   }

   // Other rules
   bool ext_binbas = false;

   if (end == false)
   {
      for (auto it = filename_vector.begin(); it != filename_vector.end(); it++)
      {
         unsigned char filename[16] = {0};
         memcpy(filename, it->c_str(), 13);
         filename[9] = filename[9] & 0x7F; // READ ONLY
         filename[8] = filename[8] & 0x7F; // HIDDEN / SYSTEM
         bool bnewbinbas = false;
         if (strnicmp((char*)&filename[8], "bin", 3) == 0
            || strnicmp((char*)&filename[8], "bas", 3) == 0
            || strnicmp((char*)&filename[8], "   ", 3) == 0)
         {
            // Priority : If it's call "sav?????.b??", it's less priority thant any other
            int nbcar = NbIdenticalCar(it->c_str(), disk_filename.c_str(), disk_filename.size());
            if (strncmp(&it->c_str()[8], "BIN", 3) == 0
               || strncmp(&it->c_str()[8], "BAS", 3) == 0
            )
               bnewbinbas = true;
            if (nbcar > nb_correct_char || nb_correct_char == 0 || (correct_hidden == true && ((it->c_str()[9] & 0x80)
               == 0)) || (bnewbinbas == true && ext_binbas == false))
            {
               if (correct_hidden == false && (it->c_str()[9] & 0x80) == 0x80)
               {
               }
               else if (bnewbinbas == false && ext_binbas == true)
               {
               }
               else
               {
                  // Update return;
                  nb_correct_char = nbcar;
                  ext_binbas = bnewbinbas;

                  correct_hidden = it->c_str()[9] & 0x80;
                  sprintf(buffer, "%8.8s", it->c_str() /*, (char*)&pTrackData[offset+8]*/);
                  for (int i = 7; i >= 0; i--)
                  {
                     if (buffer[i] == 0x20) buffer[i] = 0x00;
                     else break;
                  }
               }
            }
         }
      }
   }

   if (end || strlen(buffer) > 0)
      ret = IDisk::AUTO_FILE;

   return ret;
}